

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

void ON_EvaluatedeCasteljau(int dim,int order,int side,int cv_stride,double *cv,double t)

{
  int iVar1;
  double dVar2;
  int local_48;
  int off_minus_dim;
  int d;
  int j;
  double *P1;
  double *P0;
  double s;
  double t_local;
  double *cv_local;
  int cv_stride_local;
  int side_local;
  int order_local;
  int dim_local;
  
  if (((t != 0.0) || (NAN(t))) && ((t != 1.0 || (NAN(t))))) {
    dVar2 = 1.0 - t;
    cv_stride_local = order;
    if (dim < cv_stride) {
      iVar1 = cv_stride - dim;
      if (side < 1) {
        while (cv_stride_local = cv_stride_local + -1, cv_stride_local != 0) {
          P1 = cv + order * dim + -(long)cv_stride;
          off_minus_dim = cv_stride_local;
          _d = cv + order * dim;
          while (local_48 = dim, off_minus_dim != 0) {
            while (local_48 != 0) {
              P1 = P1 + -1;
              _d = _d + -1;
              *_d = *P1 * dVar2 + *_d * t;
              local_48 = local_48 + -1;
            }
            P1 = P1 + -(long)iVar1;
            _d = _d + -(long)iVar1;
            off_minus_dim = off_minus_dim + -1;
          }
        }
      }
      else {
        while (cv_stride_local = cv_stride_local + -1, cv_stride_local != 0) {
          _d = cv + cv_stride;
          off_minus_dim = cv_stride_local;
          P1 = cv;
          while (local_48 = dim, off_minus_dim != 0) {
            while (local_48 != 0) {
              *P1 = *P1 * dVar2 + *_d * t;
              P1 = P1 + 1;
              _d = _d + 1;
              local_48 = local_48 + -1;
            }
            P1 = P1 + iVar1;
            _d = _d + iVar1;
            off_minus_dim = off_minus_dim + -1;
          }
        }
      }
    }
    else if (side < 1) {
      while (cv_stride_local = cv_stride_local + -1, cv_stride_local != 0) {
        P1 = cv + order * dim + -(long)dim;
        off_minus_dim = cv_stride_local;
        _d = cv + order * dim;
        while (iVar1 = off_minus_dim + -1, local_48 = dim, off_minus_dim != 0) {
          while (off_minus_dim = iVar1, local_48 != 0) {
            P1 = P1 + -1;
            _d = _d + -1;
            *_d = *P1 * dVar2 + *_d * t;
            local_48 = local_48 + -1;
          }
        }
      }
    }
    else {
      while (cv_stride_local = cv_stride_local + -1, cv_stride_local != 0) {
        _d = cv + dim;
        off_minus_dim = cv_stride_local;
        P1 = cv;
        while (iVar1 = off_minus_dim + -1, local_48 = dim, off_minus_dim != 0) {
          while (off_minus_dim = iVar1, local_48 != 0) {
            *P1 = *P1 * dVar2 + *_d * t;
            P1 = P1 + 1;
            _d = _d + 1;
            local_48 = local_48 + -1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ON_EvaluatedeCasteljau(int dim, int order, int side, int cv_stride, double* cv, double t)
/*****************************************************************************
Evaluate a Bezier using the de Casteljau algorithm

INPUT:
  dim    ( >= 1)
  order  ( >= 2)
  side   <= 0  return left side of bezier in cv array
         >  0  return right side of bezier in cv array
  cv     array of order*cv_stride doubles that specify the Bezier's control
         vertices.
  cv_stride ( >= dim) number of doubles between cv's (typically a multiple of dim).
  t      If side <= 0, then t must be > 0.0.
         If side >  0, then t must be < 1.0.
OUTPUT:
  cv
         If side <= 0, the input cv's are replaced with the cv's for
         the bezier trimmed/extended to [0,t].  In particular,
         {cv[(order-1)*cv_stride], ..., cv[order*cv_stride - 1]} is the value of 
         the Bezier at t.
         If side > 0, the input cv's are replaced with the cv's for
         the Bezier trimmed/extended to [t,1].  In particular,
         {cv[0], ..., cv[dim-1]} is the value of the Bezier at t.
COMMENTS:
  Set C[i,j] = {cv[j*cv_stride], ..., cv[(j+1)*cv_stride-1]}, if i = 0
                (1-t)*C[i-1,j-1] + t*C[i-1,j], if 0 < i <= d = degree

  The collection of C[i,j]'s is typically drawn in a triangular array:

  C[0,0]
           C[1,1]
  C[0,1]              C[2,2]
           C[1,2]             ...
  C[0,2]
       
  ...                                  C[d,d]
                              ...
  C[0,d-1]            C[2,d]
           C[1,d]
  C[0,d]
      
  The value of the Bezier at t is equal to C[d,d].
      
  When side < 0, the input cv's are replaced with
          C[0,0], C[1,2], ..., C[d,d].  
  If the output cv's are used as control vertices for a Bezier, 
  then output_bezier(s) = input_bezier(t*s).
      
  When side >= 0, the input cv's are replace with
          C[d,d], C[d-1,d], ..., C[0,d].
  If the output cv's are used as control vertices for a Bezier, 
  then output_bezier(s) = input_bezier((1-s)*t + s).

  If a Bezier is going to be evaluated more than a few times, it is
  faster to convert the Bezier to power basis and evaluate using
  TL_EvHorner.  However, Horner's algorithm is not a stable as
  de Casteljau's.
EXAMPLE:
  // Use TL_EvdeCasteljau() to trim/extend a Bezier
  // to the interval [t0,t1], where t0 < t1

  double cv[order][dim], t0, t1

  cv = whatever;
  if (1.0 - t0 > t1) {
    // first trim at t0, then trim at t1
    if (t0 != 0.0) TL_EvdeCasteljau(dim,order, 1,cv,dim,t0); 
    t1 = (t1-t0)/(1.0 - t0); // adjust t1 to new domain
    if (t1 != 1.0) TL_EvdeCasteljau(dim,order,-1,cv,dim,t1);
  }
  else {
    // first trim at t1, then trim at t0
    if (t1 != 1.0) TL_EvdeCasteljau(dim,order,-1,cv,dim,t1);
    t0 /= t1; // adjust t0 to new domain
    if (t0 != 0.0) TL_EvdeCasteljau(dim,order, 1,cv,dim,t0);
  }
REFERENCE:
  BOHM-01, Page 8.
RELATED FUNCTIONS:
  TL_EvBernsteinBasis
  TL_EvBezier
  TL_EvdeBoor
  TL_EvHorner
  TL_ConvertBezierToPolynomial
*****************************************************************************/
{
  double
    s, *P0, *P1;
  int
    j, d, off_minus_dim;

  if (t == 0.0 || t == 1.0)
    return;

  s = 1.0 - t;

  /* it's ugly and it's fast */
  if (cv_stride > dim) {
    off_minus_dim = cv_stride - dim;
    if (side > 0) {
      /* output cv's = bezier trimmed to [t,1] */
      while (--order) {
        P0 = cv;                /* first cv */
        P1 = P0 + cv_stride;       /* next cv */
        j = order;
        while (j--) {
          d = dim;
          while (d--) {*P0 = (*P0 * s) + (*P1 * t); P0++; P1++;}
          P0 += off_minus_dim; P1 += off_minus_dim;}}
    }
    else {
      /* side <= 0, so output cv's = bezier trimmed to [0,t] */
      cv += order*dim;          /* now cv = last control vertex */
      while (--order) {
        P1 = cv;                /* last cv */
        P0 = P1 - cv_stride;       /* next to last cv */
        j = order;
        while (j--) {
          d = dim;
          while (d--) {P0--; P1--; *P1 = (*P0 * s) + (*P1 * t);}
          P0 -= off_minus_dim; P1 -= off_minus_dim;}}
    }
  }
  else {
    if (side > 0) {
      /* output cv's = bezier trimmed to [t,1] */
      while (--order) {
        P0 = cv;                /* first cv */
        P1 = P0 + dim;          /* next cv */
        j = order;
        while (j--) {
          d = dim;
          while (d--) {*P0 = (*P0 * s) + (*P1 * t); P0++; P1++;}}
      }
    }
    else {
      /* side <= 0, so output cv's = bezier trimmed to [0,t] */
      cv += order*dim;          /* now cv = last control vertex */
      while (--order) {
        P1 = cv;                /* last cv */
        P0 = P1 - dim;          /* next to last cv */
        j = order;
        while (j--) {
          d = dim;
          while (d--) {P0--; P1--; *P1 = (*P0 * s) + (*P1 * t);}}
      }
    }
  }
}